

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

Pattern * slang::ast::ConstantPattern::fromSyntax
                    (ExpressionPatternSyntax *syntax,Type *targetType,ASTContext *context)

{
  SourceRange assignmentRange;
  bool bVar1;
  Compilation *pCVar2;
  Expression *pEVar3;
  SourceRange *in_RDX;
  undefined8 in_RSI;
  Expression *expr;
  bitmask<slang::ast::IntegralFlags> flags;
  Type *type;
  Compilation *comp;
  Expression *in_stack_00000298;
  ASTContext *in_stack_000002a0;
  bitmask<slang::ast::EvalFlags> in_stack_000002af;
  Pattern *in_stack_fffffffffffffef8;
  Compilation *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  SourceRange *in_stack_ffffffffffffff10;
  Expression *in_stack_ffffffffffffff18;
  BumpAllocator *in_stack_ffffffffffffff20;
  byte local_b1;
  Compilation *in_stack_ffffffffffffff50;
  Type *in_stack_ffffffffffffff58;
  bitmask<slang::ast::EvalFlags> local_81;
  BumpAllocator local_80 [2];
  ASTContext *in_stack_ffffffffffffffa0;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffa8;
  Type *in_stack_ffffffffffffffb0;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  bitwidth_t in_stack_ffffffffffffffc4;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffc8;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffcc;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffcd;
  bitmask<slang::ast::IntegralFlags> in_stack_ffffffffffffffce;
  underlying_type in_stack_ffffffffffffffcf;
  bitmask<slang::ast::IntegralFlags> flags_00;
  ConstantPattern *local_8;
  
  flags_00.m_bits = (underlying_type)((ulong)in_RSI >> 0x38);
  pCVar2 = ASTContext::getCompilation((ASTContext *)0x48d0bc);
  bVar1 = Type::isIntegral((Type *)in_stack_ffffffffffffff00);
  if ((bVar1) && (bVar1 = Type::isFourState(in_stack_ffffffffffffff58), !bVar1)) {
    in_stack_ffffffffffffffce =
         Type::getIntegralFlags
                   ((Type *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    bitmask<slang::ast::IntegralFlags>::bitmask
              ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffcd,FourState);
    in_stack_ffffffffffffffcc =
         bitmask<slang::ast::IntegralFlags>::operator|
                   ((bitmask<slang::ast::IntegralFlags> *)
                    CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                    (bitmask<slang::ast::IntegralFlags> *)in_stack_ffffffffffffff00);
    Type::getBitWidth((Type *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    in_stack_ffffffffffffffcf = in_stack_ffffffffffffffcc.m_bits;
    Compilation::getType
              ((Compilation *)
               CONCAT17(in_stack_ffffffffffffffcc.m_bits,
                        CONCAT16(in_stack_ffffffffffffffce.m_bits,
                                 CONCAT15(in_stack_ffffffffffffffcd.m_bits,
                                          CONCAT14(in_stack_ffffffffffffffcc.m_bits,
                                                   in_stack_ffffffffffffffc8)))),
               in_stack_ffffffffffffffc4,flags_00);
    in_stack_ffffffffffffff50 = pCVar2;
  }
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x48d1a3);
  SourceRange::SourceRange((SourceRange *)in_stack_ffffffffffffff00);
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffa8,None);
  assignmentRange.startLoc._4_4_ = in_stack_ffffffffffffffc4;
  assignmentRange.startLoc._0_4_ = in_stack_ffffffffffffffc0;
  assignmentRange.endLoc._0_4_ = in_stack_ffffffffffffffc8;
  assignmentRange.endLoc._4_1_ = in_stack_ffffffffffffffcc.m_bits;
  assignmentRange.endLoc._5_1_ = in_stack_ffffffffffffffcd.m_bits;
  assignmentRange.endLoc._6_1_ = in_stack_ffffffffffffffce.m_bits;
  assignmentRange.endLoc._7_1_ = in_stack_ffffffffffffffcf;
  pEVar3 = Expression::bindRValue
                     (in_stack_ffffffffffffffb0,(ExpressionSyntax *)in_stack_ffffffffffffffa8.m_bits
                      ,assignmentRange,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb8);
  uVar4 = SUB84(pEVar3,0);
  uVar5 = (undefined4)((ulong)pEVar3 >> 0x20);
  bVar1 = Expression::bad((Expression *)in_stack_ffffffffffffff00);
  local_b1 = 1;
  if (!bVar1) {
    in_stack_ffffffffffffff18 = (Expression *)CONCAT44(uVar5,uVar4);
    local_81.m_bits = '\0';
    bitmask<slang::ast::EvalFlags>::bitmask(&local_81);
    in_stack_ffffffffffffff20 = local_80;
    ASTContext::eval(in_stack_000002a0,in_stack_00000298,in_stack_000002af);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x48d28e);
    local_b1 = bVar1 ^ 0xff;
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x48d2bf);
    in_stack_ffffffffffffff10 = in_RDX;
  }
  if ((local_b1 & 1) == 0) {
    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff50);
    local_8 = BumpAllocator::
              emplace<slang::ast::ConstantPattern,slang::ast::Expression_const&,slang::SourceRange>
                        (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         in_stack_ffffffffffffff10);
  }
  else {
    local_8 = (ConstantPattern *)
              Pattern::badPattern(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  return &local_8->super_Pattern;
}

Assistant:

Pattern& ConstantPattern::fromSyntax(const ExpressionPatternSyntax& syntax, const Type& targetType,
                                     const ASTContext& context) {
    // Bind the expression (it must be a constant).
    // We force integral types to be four-state here so that if we need to do a casex / casez
    // condition we will get the right result for unknowns.
    auto& comp = context.getCompilation();
    const Type* type = &targetType;
    if (type->isIntegral() && !type->isFourState()) {
        auto flags = type->getIntegralFlags() | IntegralFlags::FourState;
        type = &comp.getType(type->getBitWidth(), flags);
    }

    auto& expr = Expression::bindRValue(*type, *syntax.expr, {}, context);
    if (expr.bad() || !context.eval(expr))
        return badPattern(comp, nullptr);

    return *comp.emplace<ConstantPattern>(expr, syntax.sourceRange());
}